

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtStr.c
# Opt level: O0

newtRef NsSubStr(newtRefArg rcvr,newtRefArg r,newtRefArg start,newtRefArg count)

{
  _Bool _Var1;
  int iVar2;
  char *__s;
  size_t sVar3;
  int64_t iVar4;
  newtRef nVar5;
  char *s;
  newtRefVar theResult;
  size_t theLen;
  int theEnd;
  int theStart;
  char *theBuffer;
  char *theString;
  newtRefArg count_local;
  newtRefArg start_local;
  newtRefArg r_local;
  newtRefArg rcvr_local;
  
  _Var1 = NewtRefIsString(r);
  if (_Var1) {
    _Var1 = NewtRefIsInteger(start);
    if (_Var1) {
      __s = NewtRefToString(r);
      sVar3 = strlen(__s);
      iVar4 = NewtRefToInteger(start);
      iVar2 = (int)iVar4;
      if (sVar3 < (ulong)(long)iVar2) {
        rcvr_local = NewtMakeString("",true);
      }
      else {
        _Var1 = NewtRefIsNIL(count);
        theLen._0_4_ = (int)sVar3;
        if (!_Var1) {
          _Var1 = NewtRefIsInteger(count);
          if (!_Var1) {
            nVar5 = NewtThrow(-0xbd16,count);
            return nVar5;
          }
          iVar4 = NewtRefToInteger(count);
          theLen._0_4_ = iVar2 + (int)iVar4;
          if (sVar3 < (ulong)(long)(int)theLen) {
            theLen._0_4_ = (int)sVar3;
          }
        }
        sVar3 = (size_t)((int)theLen - iVar2);
        s = (char *)malloc(sVar3 + 1);
        memcpy(s,__s + iVar2,sVar3);
        s[sVar3] = '\0';
        rcvr_local = NewtMakeString(s,false);
        free(s);
      }
    }
    else {
      rcvr_local = NewtThrow(-0xbd16,start);
    }
  }
  else {
    rcvr_local = NewtThrow(-0xbd12,r);
  }
  return rcvr_local;
}

Assistant:

newtRef NsSubStr(newtRefArg rcvr, newtRefArg r, newtRefArg start, newtRefArg count)
{
    char* theString;
    char* theBuffer;
    int theStart, theEnd;
    size_t theLen;
    newtRefVar theResult;
    
    (void) rcvr;
    
    /* check parameters */
    if (! NewtRefIsString(r))
        return NewtThrow(kNErrNotAString, r);
    if (! NewtRefIsInteger(start))
        return NewtThrow(kNErrNotAnInteger, start);
    
    theString = NewtRefToString(r);
    theLen = strlen(theString);
    
    theStart = (int)NewtRefToInteger(start);
    if (theStart > theLen) {
        return NewtMakeString("", true);
    }
    
    if (!NewtRefIsNIL(count))
    {
        if (!NewtRefIsInteger(count))
        {
            return NewtThrow(kNErrNotAnInteger, count);
        }
        theEnd = theStart + (int)NewtRefToInteger(count);
        if (theEnd > theLen)
        {
            theEnd = (int)theLen;
        }
    } else {
        theEnd = (int)theLen;
    }
    
    /* new length */
    theLen = theEnd - theStart;
    
    /* create a buffer to copy the characters to */
    theBuffer = (char*) malloc(theLen + 1);
    (void) memcpy(theBuffer, (const char*) &theString[theStart], theLen);
    theBuffer[theLen] = 0;
    theResult = NewtMakeString(theBuffer, false);
    free(theBuffer);
    
    return theResult;
}